

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O3

void cleanup_test_files(void)

{
  uv_fs_t req;
  undefined1 auStack_1c8 [448];
  
  uv_fs_unlink(0,auStack_1c8,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_1c8);
  uv_fs_unlink(0,auStack_1c8,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_1c8);
  uv_fs_rmdir(0,auStack_1c8,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_1c8);
  uv_fs_rmdir(0,auStack_1c8,"test_dir",0);
  uv_fs_req_cleanup(auStack_1c8);
  return;
}

Assistant:

static void cleanup_test_files(void) {
  uv_fs_t req;

  uv_fs_unlink(NULL, &req, "test_dir/file1", NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_unlink(NULL, &req, "test_dir/file2", NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_rmdir(NULL, &req, "test_dir/test_subdir", NULL);
  uv_fs_req_cleanup(&req);
  uv_fs_rmdir(NULL, &req, "test_dir", NULL);
  uv_fs_req_cleanup(&req);
}